

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Step_bound_info_patch
               (int g_xx,int *xxlo,int *xxhi,int g_vv,int *vvlo,int *vvhi,int g_xxll,int *xxlllo,
               int *xxllhi,int g_xxuu,int *xxuulo,int *xxuuhi,void *boundmin,void *wolfemin,
               void *boundmax)

{
  Integer IVar1;
  Integer *pIVar2;
  long lVar3;
  long lVar4;
  Integer _ga_xxuuhi [7];
  Integer _ga_xxuulo [7];
  Integer _ga_xxllhi [7];
  Integer _ga_xxlllo [7];
  Integer _ga_vvhi [7];
  Integer _ga_vvlo [7];
  Integer _ga_xxhi [7];
  Integer _ga_xxlo [7];
  
  IVar1 = pnga_ndim((long)g_xx);
  lVar4 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  pIVar2 = _ga_xxlo + IVar1 + -1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)xxlo[lVar4] + 1;
    pIVar2 = pIVar2 + -1;
  }
  pIVar2 = _ga_xxhi + IVar1 + -1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)xxhi[lVar4] + 1;
    pIVar2 = pIVar2 + -1;
  }
  pIVar2 = _ga_vvlo + IVar1 + -1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)vvlo[lVar4] + 1;
    pIVar2 = pIVar2 + -1;
  }
  pIVar2 = _ga_vvhi + IVar1 + -1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)vvhi[lVar4] + 1;
    pIVar2 = pIVar2 + -1;
  }
  pIVar2 = _ga_xxlllo + IVar1 + -1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)xxlllo[lVar4] + 1;
    pIVar2 = pIVar2 + -1;
  }
  pIVar2 = _ga_xxllhi + IVar1 + -1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)xxllhi[lVar4] + 1;
    pIVar2 = pIVar2 + -1;
  }
  pIVar2 = _ga_xxuulo + IVar1 + -1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)xxuulo[lVar4] + 1;
    pIVar2 = pIVar2 + -1;
  }
  pIVar2 = _ga_xxuuhi + IVar1 + -1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)xxuuhi[lVar4] + 1;
    pIVar2 = pIVar2 + -1;
  }
  pnga_step_bound_info_patch
            ((long)g_xx,_ga_xxlo,_ga_xxhi,(long)g_vv,_ga_vvlo,_ga_vvhi,(long)g_xxll,_ga_xxlllo,
             _ga_xxllhi,(long)g_xxuu,_ga_xxuulo,_ga_xxuuhi,boundmin,wolfemin,boundmax);
  return;
}

Assistant:

void GA_Step_bound_info_patch(int g_xx, int xxlo[], int xxhi[],  int g_vv, int vvlo[], int vvhi[], int g_xxll, int xxlllo[], int xxllhi[], int g_xxuu,  int xxuulo[], int xxuuhi[], void *boundmin, void *wolfemin, void *boundmax)
{
    Integer xx = (Integer)g_xx;
    Integer vv = (Integer)g_vv;
    Integer xxll = (Integer)g_xxll;
    Integer xxuu = (Integer)g_xxuu;
    Integer ndim = wnga_ndim(xx);
    Integer _ga_xxlo[MAXDIM], _ga_xxhi[MAXDIM];
    Integer _ga_vvlo[MAXDIM], _ga_vvhi[MAXDIM];
    Integer _ga_xxlllo[MAXDIM], _ga_xxllhi[MAXDIM];
    Integer _ga_xxuulo[MAXDIM], _ga_xxuuhi[MAXDIM];
    COPYINDEX_C2F(xxlo,_ga_xxlo, ndim);
    COPYINDEX_C2F(xxhi,_ga_xxhi, ndim);
    COPYINDEX_C2F(vvlo,_ga_vvlo, ndim);
    COPYINDEX_C2F(vvhi,_ga_vvhi, ndim);
    COPYINDEX_C2F(xxlllo,_ga_xxlllo, ndim);
    COPYINDEX_C2F(xxllhi,_ga_xxllhi, ndim);
    COPYINDEX_C2F(xxuulo,_ga_xxuulo, ndim);
    COPYINDEX_C2F(xxuuhi,_ga_xxuuhi, ndim);
    wnga_step_bound_info_patch(xx, _ga_xxlo, _ga_xxhi, vv, _ga_vvlo, _ga_vvhi, xxll, _ga_xxlllo, _ga_xxllhi, xxuu, _ga_xxuulo, _ga_xxuuhi , 
    boundmin,wolfemin,boundmax);
}